

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

LY_ERR lyd_parse_json_restconf
                 (ly_ctx *ctx,lysc_ext_instance *ext,lyd_node *parent,lyd_node **first_p,ly_in *in,
                 uint32_t parse_opts,uint32_t val_opts,lyd_type data_type,lyd_node **envp,
                 ly_set *parsed,lyd_ctx **lydctx_p)

{
  lyjson_ctx *plVar1;
  lyd_node *plVar2;
  bool bVar3;
  lysc_ext_instance *ctx_00;
  LY_ERR LVar4;
  LYJSON_PARSER_STATUS LVar5;
  int iVar6;
  lys_module *plVar7;
  ly_err_item *plVar8;
  char *pcVar9;
  char *pcVar10;
  ly_in *local_b8;
  lysc_node *local_a8;
  ly_err_item *__eitem_2;
  ly_err_item *__eitem_1;
  ly_err_item *__eitem;
  uint32_t local_58;
  uint32_t close_elem;
  uint32_t int_opts;
  uint32_t i;
  lyd_node *node;
  lyd_json_ctx *lydctx;
  LY_ERR local_38;
  LY_ERR r;
  LY_ERR rc;
  uint32_t parse_opts_local;
  ly_in *in_local;
  lyd_node **first_p_local;
  lyd_node *parent_local;
  lysc_ext_instance *ext_local;
  ly_ctx *ctx_local;
  
  local_38 = 0;
  node = (lyd_node *)0x0;
  r = parse_opts;
  _rc = in;
  in_local = (ly_in *)first_p;
  first_p_local = (lyd_node **)parent;
  parent_local = (lyd_node *)ext;
  ext_local = (lysc_ext_instance *)ctx;
  if (((ctx == (ly_ctx *)0x0) || (in == (ly_in *)0x0)) || (lydctx_p == (lyd_ctx **)0x0)) {
    __assert_fail("ctx && in && lydctx_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x7da,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  if ((parse_opts & 0xffff) != 0) {
    __assert_fail("!(parse_opts & ~LYD_PARSE_OPTS_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x7db,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  if ((val_opts & 0xffff0000) != 0) {
    __assert_fail("!(val_opts & ~LYD_VALIDATE_OPTS_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x7dc,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  if (((data_type != LYD_TYPE_RPC_RESTCONF) && (data_type != LYD_TYPE_NOTIF_RESTCONF)) &&
     (data_type != LYD_TYPE_REPLY_RESTCONF)) {
    __assert_fail("(data_type == LYD_TYPE_RPC_RESTCONF) || (data_type == LYD_TYPE_NOTIF_RESTCONF) || (data_type == LYD_TYPE_REPLY_RESTCONF)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x7df,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  if ((parse_opts & 0x400000) != 0) {
    __assert_fail("!(parse_opts & LYD_PARSE_SUBTREE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x7e0,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  local_38 = lyd_parse_json_init(ctx,in,parse_opts,val_opts,(lyd_json_ctx **)&node);
  LVar4 = local_38;
  if (local_38 != LY_SUCCESS) goto LAB_0014edad;
  *(lyd_node **)node = parent_local;
  if (data_type == LYD_TYPE_RPC_RESTCONF) {
    if (first_p_local == (lyd_node **)0x0) {
      __assert_fail("parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                    ,0x7e9,
                    "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                   );
    }
    plVar1 = (lyjson_ctx *)node[0x4b].parent;
    plVar7 = lyd_node_module((lyd_node *)first_p_local);
    LVar4 = lydjson_envelope(plVar1,"input",plVar7->name,envp);
    if (LVar4 != LY_SUCCESS) goto LAB_0014edad;
    local_58 = 0x23;
  }
  else if (data_type == LYD_TYPE_NOTIF_RESTCONF) {
    if (first_p_local != (lyd_node **)0x0) {
      __assert_fail("!parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                    ,0x7f3,
                    "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                   );
    }
    LVar4 = lydjson_envelope((lyjson_ctx *)node[0x4b].parent,"notification","ietf-restconf",envp);
    if (LVar4 != LY_SUCCESS) goto LAB_0014edad;
    local_58 = 0xa8;
  }
  else {
    if (data_type != LYD_TYPE_REPLY_RESTCONF) {
      ly_log((ly_ctx *)ext_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c",
             0x808);
      local_38 = LY_EINT;
      LVar4 = local_38;
      goto LAB_0014edad;
    }
    if (first_p_local == (lyd_node **)0x0) {
      __assert_fail("parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                    ,0x7fe,
                    "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                   );
    }
    plVar1 = (lyjson_ctx *)node[0x4b].parent;
    plVar7 = lyd_node_module((lyd_node *)first_p_local);
    LVar4 = lydjson_envelope(plVar1,"output",plVar7->name,envp);
    if (LVar4 != LY_SUCCESS) goto LAB_0014edad;
    local_58 = 0x24;
  }
  local_38 = 0;
  *(uint32_t *)&node->parent = local_58;
  local_38 = lyd_parser_find_operation
                       ((lyd_node *)first_p_local,local_58,(lyd_node **)&node[0x4a].meta);
  LVar4 = local_38;
  if (local_38 == LY_SUCCESS) {
    do {
      lydctx._4_4_ = lydjson_subtree_r((lyd_json_ctx *)node,(lyd_node *)first_p_local,
                                       (lyd_node **)in_local,parsed);
      if ((lydctx._4_4_ != LY_SUCCESS) &&
         (((local_38 = lydctx._4_4_, plVar8 = ly_err_last(*(ly_ctx **)&(node[0x4b].parent)->field_0)
           , LVar4 = local_38, lydctx._4_4_ != LY_EVALID || (node == (lyd_node *)0x0)) ||
          ((((ulong)node->schema & 0x400000000) == 0 || (plVar8->vecode == LYVE_SYNTAX))))))
      goto LAB_0014edad;
      LVar5 = lyjson_ctx_status((lyjson_ctx *)node[0x4b].parent);
    } while (LVar5 == LYJSON_OBJECT_NEXT);
    bVar3 = false;
    while (!bVar3) {
      LVar5 = lyjson_ctx_status((lyjson_ctx *)node[0x4b].parent);
      ctx_00 = ext_local;
      if (LVar5 != LYJSON_OBJECT_CLOSED) {
        pcVar9 = lyjson_token2str(LYJSON_OBJECT_CLOSED);
        LVar5 = lyjson_ctx_status((lyjson_ctx *)node[0x4b].parent);
        pcVar10 = lyjson_token2str(LVar5);
        ly_vlog((ly_ctx *)ctx_00,(char *)0x0,LYVE_SYNTAX_JSON,"Expecting JSON %s but %s found.",
                pcVar9,pcVar10);
        local_38 = LY_EVALID;
        LVar4 = local_38;
        goto LAB_0014edad;
      }
      lydctx._4_4_ = lyjson_ctx_next((lyjson_ctx *)node[0x4b].parent,(LYJSON_PARSER_STATUS *)0x0);
      LVar4 = lydctx._4_4_;
      if (lydctx._4_4_ != LY_SUCCESS) goto LAB_0014edad;
      bVar3 = true;
    }
    if (((local_58 & 0xf) != 0) && (node[0x4a].meta == (lyd_meta *)0x0)) {
      ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_DATA,"Missing the operation node.");
      lydctx._4_4_ = LY_EVALID;
      local_38 = LY_EVALID;
      plVar8 = ly_err_last(*(ly_ctx **)&(node[0x4b].parent)->field_0);
      LVar4 = local_38;
      if ((lydctx._4_4_ != LY_EVALID) ||
         (((node == (lyd_node *)0x0 || (((ulong)node->schema & 0x400000000) == 0)) ||
          (plVar8->vecode == LYVE_SYNTAX)))) goto LAB_0014edad;
    }
    if ((local_58 & 0x80) != 0) {
      plVar2 = *(lyd_node **)(*(long *)in_local + 0x20);
      if (plVar2->schema == (lysc_node *)0x0) {
        if (plVar2->schema == (lysc_node *)0x0) {
          local_a8 = plVar2[1].schema;
        }
        else {
          local_a8 = (lysc_node *)plVar2->schema->name;
        }
        iVar6 = strcmp((char *)local_a8,"eventTime");
        if ((iVar6 != 0) || (*(long *)(*(long *)in_local + 0x18) == 0)) {
          __assert_fail("!strcmp(LYD_NAME(node), \"eventTime\") && (*first_p)->next",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                        ,0x833,
                        "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                       );
        }
        lyd_unlink(plVar2);
        if (*envp == (lyd_node *)0x0) {
          __assert_fail("*envp",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                        ,0x835,
                        "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                       );
        }
        lyd_insert_child(*envp,plVar2);
      }
      else {
        ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_DATA,"Missing notification \"eventTime\" node."
               );
        lydctx._4_4_ = LY_EVALID;
        local_38 = LY_EVALID;
        plVar8 = ly_err_last(*(ly_ctx **)&(node[0x4b].parent)->field_0);
        LVar4 = local_38;
        if (((lydctx._4_4_ != LY_EVALID) || (node == (lyd_node *)0x0)) ||
           ((((ulong)node->schema & 0x400000000) == 0 || (plVar8->vecode == LYVE_SYNTAX))))
        goto LAB_0014edad;
      }
    }
    plVar2 = node;
    if (first_p_local == (lyd_node **)0x0) {
      local_b8 = in_local;
    }
    else {
      local_b8 = (ly_in *)lyd_node_child_p((lyd_node *)first_p_local);
    }
    lydctx._4_4_ = lydjson_metadata_finish((lyd_json_ctx *)plVar2,(lyd_node **)local_b8);
    LVar4 = local_38;
    if (lydctx._4_4_ != LY_SUCCESS) {
      LVar4 = lydctx._4_4_;
    }
  }
LAB_0014edad:
  local_38 = LVar4;
  if ((((r & 0x10000) != LY_SUCCESS) && (node != (lyd_node *)0x0)) &&
     ((*(int *)((long)&node[0x49].prev + 4) != 0 ||
      ((*(int *)((long)&node[0x49].priv + 4) != 0 || (*(int *)((long)&node[0x49].parent + 4) != 0)))
      ))) {
    __assert_fail("!(parse_opts & LYD_PARSE_ONLY) || !lydctx || (!lydctx->node_types.count && !lydctx->meta_types.count && !lydctx->node_when.count)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x841,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  if (local_38 == LY_SUCCESS) {
    *lydctx_p = (lyd_ctx *)node;
    lyjson_ctx_free((lyjson_ctx *)node[0x4b].parent);
    node[0x4b].parent = (lyd_node_inner *)0x0;
  }
  else {
    lyd_json_ctx_free((lyd_ctx *)node);
  }
  return local_38;
}

Assistant:

LY_ERR
lyd_parse_json_restconf(const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, struct lyd_node *parent,
        struct lyd_node **first_p, struct ly_in *in, uint32_t parse_opts, uint32_t val_opts, enum lyd_type data_type,
        struct lyd_node **envp, struct ly_set *parsed, struct lyd_ctx **lydctx_p)
{
    LY_ERR rc = LY_SUCCESS, r;
    struct lyd_json_ctx *lydctx = NULL;
    struct lyd_node *node;
    uint32_t i, int_opts = 0, close_elem = 0;

    assert(ctx && in && lydctx_p);
    assert(!(parse_opts & ~LYD_PARSE_OPTS_MASK));
    assert(!(val_opts & ~LYD_VALIDATE_OPTS_MASK));

    assert((data_type == LYD_TYPE_RPC_RESTCONF) || (data_type == LYD_TYPE_NOTIF_RESTCONF) ||
            (data_type == LYD_TYPE_REPLY_RESTCONF));
    assert(!(parse_opts & LYD_PARSE_SUBTREE));

    /* init context */
    rc = lyd_parse_json_init(ctx, in, parse_opts, val_opts, &lydctx);
    LY_CHECK_GOTO(rc, cleanup);
    lydctx->ext = ext;

    switch (data_type) {
    case LYD_TYPE_RPC_RESTCONF:
        assert(parent);

        /* parse "input" */
        rc = lydjson_envelope(lydctx->jsonctx, "input", lyd_node_module(parent)->name, envp);
        LY_CHECK_GOTO(rc, cleanup);

        int_opts = LYD_INTOPT_WITH_SIBLINGS | LYD_INTOPT_RPC | LYD_INTOPT_ACTION;
        close_elem = 1;
        break;
    case LYD_TYPE_NOTIF_RESTCONF:
        assert(!parent);

        /* parse "notification" */
        rc = lydjson_envelope(lydctx->jsonctx, "notification", "ietf-restconf", envp);
        LY_CHECK_GOTO(rc, cleanup);

        /* RESTCONF notification and eventTime */
        int_opts = LYD_INTOPT_WITH_SIBLINGS | LYD_INTOPT_NOTIF | LYD_INTOPT_EVENTTIME;
        close_elem = 1;
        break;
    case LYD_TYPE_REPLY_RESTCONF:
        assert(parent);

        /* parse "output" */
        rc = lydjson_envelope(lydctx->jsonctx, "output", lyd_node_module(parent)->name, envp);
        LY_CHECK_GOTO(rc, cleanup);

        int_opts = LYD_INTOPT_WITH_SIBLINGS | LYD_INTOPT_REPLY;
        close_elem = 1;
        break;
    default:
        LOGINT(ctx);
        rc = LY_EINT;
        goto cleanup;
    }

    lydctx->int_opts = int_opts;

    /* find the operation node if it exists already */
    LY_CHECK_GOTO(rc = lyd_parser_find_operation(parent, int_opts, &lydctx->op_node), cleanup);

    /* read subtree(s) */
    do {
        r = lydjson_subtree_r(lydctx, parent, first_p, parsed);
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    } while (lyjson_ctx_status(lydctx->jsonctx) == LYJSON_OBJECT_NEXT);

    /* close all opened elements */
    for (i = 0; i < close_elem; ++i) {
        if (lyjson_ctx_status(lydctx->jsonctx) != LYJSON_OBJECT_CLOSED) {
            LOGVAL(ctx, LYVE_SYNTAX_JSON, "Expecting JSON %s but %s found.", lyjson_token2str(LYJSON_OBJECT_CLOSED),
                    lyjson_token2str(lyjson_ctx_status(lydctx->jsonctx)));
            rc = LY_EVALID;
            goto cleanup;
        }

        r = lyjson_ctx_next(lydctx->jsonctx, NULL);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    }

    if ((int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_ACTION | LYD_INTOPT_NOTIF | LYD_INTOPT_REPLY)) && !lydctx->op_node) {
        LOGVAL(ctx, LYVE_DATA, "Missing the operation node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }
    if (int_opts & LYD_INTOPT_EVENTTIME) {
        /* parse as a child of the envelope */
        node = (*first_p)->prev;
        if (node->schema) {
            LOGVAL(ctx, LYVE_DATA, "Missing notification \"eventTime\" node.");
            r = LY_EVALID;
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
        } else {
            /* can be the only opaque node and an operation had to be parsed */
            assert(!strcmp(LYD_NAME(node), "eventTime") && (*first_p)->next);
            lyd_unlink(node);
            assert(*envp);
            lyd_insert_child(*envp, node);
        }
    }

    /* finish linking metadata */
    r = lydjson_metadata_finish(lydctx, parent ? lyd_node_child_p(parent) : first_p);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

cleanup:
    /* there should be no unres stored if validation should be skipped */
    assert(!(parse_opts & LYD_PARSE_ONLY) || !lydctx || (!lydctx->node_types.count && !lydctx->meta_types.count &&
            !lydctx->node_when.count));

    if (rc) {
        lyd_json_ctx_free((struct lyd_ctx *)lydctx);
    } else {
        *lydctx_p = (struct lyd_ctx *)lydctx;

        /* the JSON context is no more needed, freeing it also stops logging line numbers which would be confusing now */
        lyjson_ctx_free(lydctx->jsonctx);
        lydctx->jsonctx = NULL;
    }
    return rc;
}